

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O1

bool __thiscall
Assimp::FindDegeneratesProcess::ExecuteOnMesh(FindDegeneratesProcess *this,aiMesh *mesh)

{
  aiVector3D *paVar1;
  uint *puVar2;
  aiFace *paVar3;
  void *pvVar4;
  Logger *pLVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  vector<bool,_std::allocator<bool>_> remove_me;
  vector<bool,_std::allocator<bool>_> local_220;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  iVar12 = 0;
  mesh->mPrimitiveTypes = 0;
  local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  if (this->mConfigRemoveDegenerates == true) {
    std::vector<bool,_std::allocator<bool>_>::resize(&local_220,(ulong)mesh->mNumFaces,false);
  }
  if (mesh->mNumFaces != 0) {
    uVar10 = 0;
    iVar12 = 0;
    do {
      paVar3 = mesh->mFaces + uVar10;
      uVar6 = mesh->mFaces[uVar10].mNumIndices;
      uVar14 = (ulong)uVar6;
      bVar18 = uVar6 != 0;
      local_1d0 = uVar10;
      if (bVar18) {
        local_1d8 = 1L << ((byte)uVar10 & 0x3f);
        local_1e0 = uVar10 >> 6;
        bVar13 = true;
        uVar10 = 0;
        do {
          uVar6 = (int)uVar10 + 2;
          uVar8 = (ulong)uVar6;
          if ((uint)uVar14 <= uVar6) {
            uVar8 = uVar14;
          }
          if ((uint)uVar14 < 5) {
            uVar8 = uVar14;
          }
          uVar15 = uVar10 + 1;
          bVar17 = uVar15 < uVar8;
          if (bVar17) {
            uVar14 = uVar15 & 0xffffffff;
            do {
              paVar1 = mesh->mVertices;
              uVar6 = paVar3->mIndices[uVar10];
              uVar9 = (uint)uVar14;
              uVar7 = paVar3->mIndices[uVar14];
              if ((paVar1[uVar6].x == paVar1[uVar7].x) &&
                 (!NAN(paVar1[uVar6].x) && !NAN(paVar1[uVar7].x))) {
                if ((paVar1[uVar6].y == paVar1[uVar7].y) &&
                   (!NAN(paVar1[uVar6].y) && !NAN(paVar1[uVar7].y))) {
                  if ((paVar1[uVar6].z == paVar1[uVar7].z) &&
                     (!NAN(paVar1[uVar6].z) && !NAN(paVar1[uVar7].z))) {
                    uVar6 = paVar3->mNumIndices - 1;
                    uVar11 = (ulong)uVar6;
                    paVar3->mNumIndices = uVar6;
                    if (uVar9 < uVar6) {
                      do {
                        paVar3->mIndices[uVar14] = paVar3->mIndices[uVar14 + 1];
                        uVar14 = uVar14 + 1;
                        uVar11 = (ulong)paVar3->mNumIndices;
                      } while (uVar14 < uVar11);
                    }
                    iVar12 = iVar12 + (uint)bVar13;
                    if (bVar13) {
                      bVar13 = false;
                    }
                    paVar3->mIndices[uVar11] = 0xdeadbeef;
                    if (this->mConfigRemoveDegenerates != false) {
                      local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_1e0] =
                           local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [local_1e0] | local_1d8;
                      break;
                    }
                    uVar8 = (ulong)((int)uVar8 - 1);
                    uVar9 = uVar9 - 1;
                  }
                }
              }
              uVar14 = (ulong)(uVar9 + 1);
              bVar17 = uVar9 + 1 < (uint)uVar8;
            } while (bVar17);
          }
          if (bVar17) break;
          if ((this->mConfigCheckAreaOfTriangle == true) && (paVar3->mNumIndices == 3)) {
            paVar1 = mesh->mVertices;
            puVar2 = paVar3->mIndices;
            uVar6 = *puVar2;
            uVar7 = puVar2[1];
            local_1f0 = paVar1[uVar6].x;
            local_1ec = paVar1[uVar6].y;
            local_1e8 = paVar1[uVar6].z;
            local_1f8 = paVar1[uVar7].x;
            local_1f4 = paVar1[uVar7].y;
            fVar25 = paVar1[uVar7].z;
            uVar6 = puVar2[2];
            fVar19 = paVar1[uVar6].x;
            fVar26 = paVar1[uVar6].y;
            fVar23 = paVar1[uVar6].z;
            fVar24 = fVar25 - local_1e8;
            dVar20 = pow((double)(fVar24 * fVar24 +
                                 (local_1f8 - local_1f0) * (local_1f8 - local_1f0) +
                                 (local_1f4 - local_1ec) * (local_1f4 - local_1ec)),0.5);
            local_1e4 = (float)dVar20;
            fVar24 = fVar19 - local_1f8;
            fVar22 = fVar26 - local_1f4;
            fVar25 = fVar23 - fVar25;
            dVar20 = pow((double)(fVar25 * fVar25 + fVar24 * fVar24 + fVar22 * fVar22),0.5);
            fVar19 = local_1f0 - fVar19;
            fVar26 = local_1ec - fVar26;
            fVar23 = local_1e8 - fVar23;
            dVar21 = pow((double)(fVar23 * fVar23 + fVar19 * fVar19 + fVar26 * fVar26),0.5);
            fVar25 = (local_1e4 + (float)dVar20 + (float)dVar21) * 0.5;
            dVar20 = pow((double)((fVar25 - (float)dVar21) *
                                 (fVar25 - (float)dVar20) * (fVar25 - local_1e4) * fVar25),0.5);
            bVar17 = true;
            if (((float)dVar20 < 1e-06) && (this->mConfigRemoveDegenerates == true)) {
              local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[local_1e0] =
                   local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_1e0] |
                   local_1d8;
              iVar12 = iVar12 + 1;
              bVar17 = false;
            }
            if (!bVar17) break;
          }
          uVar14 = (ulong)paVar3->mNumIndices;
          bVar18 = uVar15 < uVar14;
          uVar10 = uVar15;
        } while (bVar18);
      }
      if (!bVar18) {
        uVar7 = paVar3->mNumIndices - 1;
        uVar6 = 8;
        if (uVar7 < 3) {
          uVar6 = *(uint *)(&DAT_006ac0dc + (ulong)uVar7 * 4);
        }
        mesh->mPrimitiveTypes = uVar6 | mesh->mPrimitiveTypes;
      }
      uVar10 = local_1d0 + 1;
    } while (uVar10 < mesh->mNumFaces);
  }
  if ((this->mConfigRemoveDegenerates == true) && (iVar12 != 0)) {
    if (mesh->mNumFaces == 0) {
      uVar6 = 0;
    }
    else {
      uVar14 = 0;
      lVar16 = 8;
      uVar10 = 0;
      do {
        paVar3 = mesh->mFaces;
        if ((local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
          uVar8 = (ulong)((int)uVar10 + 1);
          paVar3[uVar10].mNumIndices = *(uint *)((long)paVar3 + lVar16 + -8);
          paVar3[uVar10].mIndices = *(uint **)((long)&paVar3->mNumIndices + lVar16);
          if (uVar14 != uVar10) {
            *(undefined4 *)((long)paVar3 + lVar16 + -8) = 0;
            *(undefined8 *)((long)&paVar3->mNumIndices + lVar16) = 0;
          }
        }
        else {
          pvVar4 = *(void **)((long)&paVar3->mNumIndices + lVar16);
          if (pvVar4 != (void *)0x0) {
            operator_delete__(pvVar4);
          }
          *(undefined8 *)((long)&paVar3->mNumIndices + lVar16) = 0;
          *(undefined4 *)((long)paVar3 + lVar16 + -8) = 0;
          uVar8 = uVar10;
        }
        uVar6 = (uint)uVar8;
        uVar14 = uVar14 + 1;
        lVar16 = lVar16 + 0x10;
        uVar10 = uVar8;
      } while (uVar14 < mesh->mNumFaces);
    }
    mesh->mNumFaces = uVar6;
    if (uVar6 == 0) {
      pLVar5 = DefaultLogger::get();
      bVar18 = true;
      Logger::debug(pLVar5,"FindDegeneratesProcess removed a mesh full of degenerated primitives");
      goto LAB_003cb714;
    }
  }
  if ((iVar12 != 0) && (bVar18 = DefaultLogger::isNullLogger(), !bVar18)) {
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[7]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [7])0x6ac20b);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," degenerated primitives",0x17);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar5,(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  bVar18 = false;
LAB_003cb714:
  if (local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar18;
}

Assistant:

bool FindDegeneratesProcess::ExecuteOnMesh( aiMesh* mesh) {
    mesh->mPrimitiveTypes = 0;

    std::vector<bool> remove_me;
    if (mConfigRemoveDegenerates) {
        remove_me.resize( mesh->mNumFaces, false );
    }

    unsigned int deg = 0, limit;
    for ( unsigned int a = 0; a < mesh->mNumFaces; ++a ) {
        aiFace& face = mesh->mFaces[a];
        bool first = true;

        // check whether the face contains degenerated entries
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            // Polygons with more than 4 points are allowed to have double points, that is
            // simulating polygons with holes just with concave polygons. However,
            // double points may not come directly after another.
            limit = face.mNumIndices;
            if (face.mNumIndices > 4) {
                limit = std::min( limit, i+2 );
            }

            for (unsigned int t = i+1; t < limit; ++t) {
                if (mesh->mVertices[face.mIndices[ i ] ] == mesh->mVertices[ face.mIndices[ t ] ]) {
                    // we have found a matching vertex position
                    // remove the corresponding index from the array
                    --face.mNumIndices;
                    --limit;
                    for (unsigned int m = t; m < face.mNumIndices; ++m) {
                        face.mIndices[ m ] = face.mIndices[ m+1 ];
                    }
                    --t;

                    // NOTE: we set the removed vertex index to an unique value
                    // to make sure the developer gets notified when his
                    // application attempts to access this data.
                    face.mIndices[ face.mNumIndices ] = 0xdeadbeef;

                    if(first) {
                        ++deg;
                        first = false;
                    }

                    if ( mConfigRemoveDegenerates ) {
                        remove_me[ a ] = true;
                        goto evil_jump_outside; // hrhrhrh ... yeah, this rocks baby!
                    }
                }
            }

            if ( mConfigCheckAreaOfTriangle ) {
                if ( face.mNumIndices == 3 ) {
                    ai_real area = calculateAreaOfTriangle( face, mesh );
                    if ( area < 1e-6 ) {
                        if ( mConfigRemoveDegenerates ) {
                            remove_me[ a ] = true;
                            ++deg;
                            goto evil_jump_outside;
                        }

                        // todo: check for index which is corrupt.
                    }
                }
            }
        }

        // We need to update the primitive flags array of the mesh.
        switch (face.mNumIndices)
        {
        case 1u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
            break;
        case 2u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
            break;
        case 3u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            break;
        default:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            break;
        };
evil_jump_outside:
        continue;
    }

    // If AI_CONFIG_PP_FD_REMOVE is true, remove degenerated faces from the import
    if (mConfigRemoveDegenerates && deg) {
        unsigned int n = 0;
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)
        {
            aiFace& face_src = mesh->mFaces[a];
            if (!remove_me[a]) {
                aiFace& face_dest = mesh->mFaces[n++];

                // Do a manual copy, keep the index array
                face_dest.mNumIndices = face_src.mNumIndices;
                face_dest.mIndices    = face_src.mIndices;

                if (&face_src != &face_dest) {
                    // clear source
                    face_src.mNumIndices = 0;
                    face_src.mIndices = nullptr;
                }
            }
            else {
                // Otherwise delete it if we don't need this face
                delete[] face_src.mIndices;
                face_src.mIndices = nullptr;
                face_src.mNumIndices = 0;
            }
        }
        // Just leave the rest of the array unreferenced, we don't care for now
        mesh->mNumFaces = n;
        if (!mesh->mNumFaces) {
            //The whole mesh consists of degenerated faces
            //signal upward, that this mesh should be deleted.
            ASSIMP_LOG_DEBUG("FindDegeneratesProcess removed a mesh full of degenerated primitives");
            return true;
        }
    }

    if (deg && !DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_WARN_F( "Found ", deg, " degenerated primitives");
    }
    return false;
}